

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O3

sysbvm_tuple_t
sysbvm_astIfNode_primitiveEvaluate
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  sysbvm_tuple_t sVar1;
  anon_struct_8_1_e241f3bb gcFrame;
  sysbvm_stackFrameSourcePositionRecord_t sourcePositionRecord;
  sysbvm_tuple_t local_78;
  sysbvm_stackFrameRecord_t local_70;
  undefined8 local_60;
  sysbvm_stackFrameRecord_t local_58;
  undefined8 local_48;
  undefined1 *local_40;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  local_78 = 0;
  local_58.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_58.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_58._12_4_ = 0;
  local_48 = 1;
  local_40 = (undefined1 *)&local_78;
  sysbvm_stackFrame_pushRecord(&local_58);
  local_70.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_70.type = SYSBVM_STACK_FRAME_RECORD_TYPE_SOURCE_POSITION;
  local_60 = *(undefined8 *)(*arguments + 0x10);
  sysbvm_stackFrame_pushRecord(&local_70);
  sVar1 = sysbvm_interpreter_evaluateASTWithEnvironment
                    (context,*(sysbvm_tuple_t *)(*arguments + 0x28),arguments[1]);
  local_78 = sVar1;
  sysbvm_stackFrame_popRecord(&local_70);
  sysbvm_stackFrame_popRecord(&local_58);
  if (sVar1 == 0x1f) {
    sVar1 = *(sysbvm_tuple_t *)(*arguments + 0x30);
  }
  else {
    sVar1 = *(sysbvm_tuple_t *)(*arguments + 0x38);
  }
  if (sVar1 == 0) {
    sVar1 = 0x2f;
  }
  else {
    sVar1 = sysbvm_interpreter_evaluateASTWithEnvironment(context,sVar1,arguments[1]);
  }
  return sVar1;
}

Assistant:

static sysbvm_tuple_t sysbvm_astIfNode_primitiveEvaluate(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *node = &arguments[0];
    sysbvm_tuple_t *environment = &arguments[1];

    sysbvm_astIfNode_t **ifNode = (sysbvm_astIfNode_t**)node;

    struct {
        sysbvm_tuple_t condition;
    } gcFrame = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);
    SYSBVM_STACKFRAME_PUSH_SOURCE_POSITION(sourcePositionRecord, (*ifNode)->super.sourcePosition);
    gcFrame.condition = sysbvm_interpreter_evaluateASTWithEnvironment(context, (*ifNode)->conditionExpression, *environment);
    if(sysbvm_tuple_boolean_decode(gcFrame.condition))
    {
        SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
        SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
        if(!(*ifNode)->trueExpression)
            return SYSBVM_VOID_TUPLE;
        return sysbvm_interpreter_evaluateASTWithEnvironment(context, (*ifNode)->trueExpression, *environment);
    }
    else
    {
        SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
        SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
        if(!(*ifNode)->falseExpression)
            return SYSBVM_VOID_TUPLE;
        return sysbvm_interpreter_evaluateASTWithEnvironment(context, (*ifNode)->falseExpression, *environment);
    }
}